

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O0

void __thiscall
vkt::texture::SampleVerifier::getMipmapStepBounds
          (SampleVerifier *this,Vec2 *lodFracBounds,deInt32 *stepMin,deInt32 *stepMax)

{
  int iVar1;
  deInt32 dVar2;
  int iVar3;
  float *pfVar4;
  int mipmapSteps;
  deInt32 *stepMax_local;
  deInt32 *stepMin_local;
  Vec2 *lodFracBounds_local;
  SampleVerifier *this_local;
  
  iVar1 = 1 << ((byte)this->m_mipmapBits & 0x1f);
  pfVar4 = tcu::Vector<float,_2>::operator[](lodFracBounds,0);
  dVar2 = deFloorFloatToInt32(*pfVar4 * (float)iVar1);
  *stepMin = dVar2;
  pfVar4 = tcu::Vector<float,_2>::operator[](lodFracBounds,1);
  dVar2 = deCeilFloatToInt32(*pfVar4 * (float)iVar1);
  *stepMax = dVar2;
  iVar3 = de::max<int>(*stepMin,0);
  *stepMin = iVar3;
  iVar1 = de::min<int>(*stepMax,iVar1);
  *stepMax = iVar1;
  return;
}

Assistant:

void SampleVerifier::getMipmapStepBounds (const Vec2&	lodFracBounds,
										  deInt32&		stepMin,
										  deInt32&		stepMax) const
{
	DE_ASSERT(m_mipmapBits < 32);
	const int mipmapSteps = ((int)1) << m_mipmapBits;

	stepMin = deFloorFloatToInt32(lodFracBounds[0] * (float)mipmapSteps);
	stepMax = deCeilFloatToInt32 (lodFracBounds[1] * (float)mipmapSteps);

	stepMin = de::max(stepMin, (deInt32)0);
	stepMax = de::min(stepMax, (deInt32)mipmapSteps);
}